

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

shared_ptr<embree::Texture> __thiscall
embree::CoronaLoader::loadMap(CoronaLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  pointer pRVar1;
  bool bVar2;
  iterator iVar3;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Ref<embree::XML> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  CoronaLoader *this_01;
  char *this_02;
  Ref<embree::XML> *child;
  pointer pRVar6;
  shared_ptr<embree::Texture> sVar7;
  FileName src;
  string mapClass;
  allocator local_99;
  key_type local_98;
  undefined1 local_78 [8];
  string local_70;
  string local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  bVar2 = std::operator==(&in_RDX->ptr->name,"map");
  _Var5._M_pi = extraout_RDX;
  if (bVar2) {
    this_00 = in_RDX->ptr;
    std::__cxx11::string::string((string *)(local_78 + 8),"class",(allocator *)&local_98);
    XML::parm(&local_50,this_00,(string *)(local_78 + 8));
    std::__cxx11::string::~string((string *)(local_78 + 8));
    bVar2 = std::operator==(&local_50,"Texture");
    if (bVar2) {
      this_01 = (CoronaLoader *)in_RDX->ptr;
      std::__cxx11::string::string((string *)&local_98,"image",&local_99);
      XML::child((XML *)local_78,(string *)this_01);
      load<embree::FileName>((FileName *)(local_78 + 8),this_01,(Ref<embree::XML> *)local_78);
      if (local_78 != (undefined1  [8])0x0) {
        (*((RefCount *)local_78)->_vptr_RefCount[3])();
      }
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string((string *)&local_98,(string *)(local_78 + 8));
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                      *)(xml + 0x10),&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      if (iVar3._M_node == (_Base_ptr)(xml + 0x11)) {
        FileName::operator+((FileName *)&local_98,(FileName *)xml,(FileName *)(local_78 + 8));
        Texture::load((Texture *)this,(FileName *)&local_98);
      }
      else {
        std::__cxx11::string::string((string *)&local_98,(string *)(local_78 + 8));
        p_Var4 = &std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                                *)(xml + 0x10),&local_98)->
                  super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var4);
      }
      std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      this_02 = "Reference";
      bVar2 = std::operator==(&local_50,"Reference");
      if (!bVar2) {
        std::__cxx11::string::~string((string *)&local_50);
        _Var5._M_pi = extraout_RDX_01;
        goto LAB_001926af;
      }
      load<std::__cxx11::string>((string *)(local_78 + 8),(CoronaLoader *)this_02,in_RDX);
      p_Var4 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                              *)(xml + 10),(key_type *)(local_78 + 8))->
                super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var4);
    }
    std::__cxx11::string::~string((string *)(local_78 + 8));
    std::__cxx11::string::~string((string *)&local_50);
    _Var5._M_pi = extraout_RDX_00;
  }
  else {
LAB_001926af:
    pRVar1 = (in_RDX->ptr->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar6 = (in_RDX->ptr->children).
                  super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar6 != pRVar1; pRVar6 = pRVar6 + 1)
    {
      sVar7 = loadMap(this,xml);
      _Var5 = sVar7.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      if ((this->path).filename._M_dataplus._M_p != (pointer)0x0) goto LAB_001926f1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->path).filename._M_string_length);
      _Var5._M_pi = extraout_RDX_02;
    }
    (this->path).filename._M_dataplus._M_p = (pointer)0x0;
    (this->path).filename._M_string_length = 0;
  }
LAB_001926f1:
  sVar7.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar7.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<embree::Texture>)
         sVar7.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> CoronaLoader::loadMap(const Ref<XML>& xml) 
  {
    /* process map node */
    if (xml->name == "map")
    {
      std::string mapClass = xml->parm("class");

      /* load textures */
      if (mapClass == "Texture")
      {
        const FileName src = load<FileName>(xml->child("image"));
        
        /* load images only once */
        if (textureFileMap.find(src) != textureFileMap.end())
          return textureFileMap[src];
        
        try {
          return Texture::load(path+src);
        } catch (const std::runtime_error& e) {
          std::cerr << "failed to load " << path+src << ": " << e.what() << std::endl;
        }
      }
      else if (mapClass == "Reference") {
        const std::string name = load<std::string>(xml);
        return textureMap[name];
      }
    }

    /* recurse into every unknown node to find some texture */
    for (auto& child : xml->children) {
      std::shared_ptr<Texture> texture = loadMap(child);
      if (texture) return texture;
    }
    return std::shared_ptr<Texture>();
  }